

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

int Kit_SopBestLiteral(Kit_Sop_t *cSop,int nLits,uint uMask)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  if (nLits < 1) {
    return -1;
  }
  uVar4 = 0;
  uVar1 = 0xffffffff;
  uVar2 = 0xffffffff;
  do {
    if ((uMask >> (uVar4 & 0x1f) & 1) != 0) {
      if ((long)cSop->nCubes < 1) {
        uVar5 = 0;
      }
      else {
        lVar3 = 0;
        uVar5 = 0;
        do {
          if (cSop->pCubes[lVar3] == 0) break;
          uVar5 = uVar5 + ((cSop->pCubes[lVar3] >> (uVar4 & 0x1f) & 1) != 0);
          lVar3 = lVar3 + 1;
        } while (cSop->nCubes != lVar3);
      }
      if (1 < uVar5 && (int)uVar1 < (int)uVar5) {
        uVar1 = uVar5;
        uVar2 = uVar4;
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == nLits) {
      uVar4 = 0xffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = uVar2;
      }
      return uVar4;
    }
  } while( true );
}

Assistant:

int Kit_SopBestLiteral( Kit_Sop_t * cSop, int nLits, unsigned uMask )
{
    unsigned uCube;
    int i, k, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < nLits; i++ )
    {
        if ( !Kit_CubeHasLit(uMask, i) )
            continue;
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        // skip the literal that does not occur or occurs once
        if ( nLitsCur < 2 )
            continue;
        // check if this is the best literal
        if ( fUseFirst )
        {
            if ( nLitsMax < nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
        else
        {
            if ( nLitsMax <= nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
    }
    if ( nLitsMax >= 0 )
        return iMax;
    return -1;
}